

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O1

Vec_Int_t * Acec_FindXorRoots(Gia_Man_t *p,Vec_Int_t *vXors)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  Vec_Bit_t *__ptr;
  Vec_Int_t *pVVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  
  __ptr = Acec_MapXorIns(p,vXors);
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar5->pArray = piVar6;
  if (0 < vXors->nSize) {
    iVar9 = 0;
    uVar4 = 0;
    do {
      uVar4 = vXors->pArray[uVar4];
      if (((int)uVar4 < 0) || (__ptr->nSize <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      if (((uint)__ptr->pArray[uVar4 >> 5] >> (uVar4 & 0x1f) & 1) == 0) {
        uVar1 = pVVar5->nSize;
        lVar8 = (long)(int)uVar1;
        if (0 < lVar8) {
          lVar7 = 0;
          do {
            if (pVVar5->pArray[lVar7] == uVar4) goto LAB_0067e487;
            lVar7 = lVar7 + 1;
          } while (lVar8 != lVar7);
        }
        uVar2 = pVVar5->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar5->pArray == (int *)0x0) {
              piVar6 = (int *)malloc(0x40);
            }
            else {
              piVar6 = (int *)realloc(pVVar5->pArray,0x40);
            }
            pVVar5->pArray = piVar6;
            iVar10 = 0x10;
          }
          else {
            iVar10 = uVar2 * 2;
            if (iVar10 <= (int)uVar2) goto LAB_0067e453;
            if (pVVar5->pArray == (int *)0x0) {
              piVar6 = (int *)malloc((ulong)uVar2 << 3);
            }
            else {
              piVar6 = (int *)realloc(pVVar5->pArray,(ulong)uVar2 << 3);
            }
            pVVar5->pArray = piVar6;
          }
          if (piVar6 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar5->nCap = iVar10;
        }
LAB_0067e453:
        pVVar5->nSize = uVar1 + 1;
        if (0 < (int)uVar1) {
          piVar6 = pVVar5->pArray;
          do {
            iVar10 = piVar6[lVar8 + -1];
            if (iVar10 <= (int)uVar4) goto LAB_0067e47c;
            piVar6[lVar8] = iVar10;
            bVar3 = 1 < lVar8;
            lVar8 = lVar8 + -1;
          } while (bVar3);
          lVar8 = 0;
        }
LAB_0067e47c:
        pVVar5->pArray[(int)lVar8] = uVar4;
      }
LAB_0067e487:
      iVar9 = iVar9 + 1;
      uVar4 = iVar9 * 4;
    } while ((int)uVar4 < vXors->nSize);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Bit_t *)0x0) {
    free(__ptr);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Acec_FindXorRoots( Gia_Man_t * p, Vec_Int_t * vXors )
{
    Vec_Bit_t * vMapXorIns = Acec_MapXorIns( p, vXors );
    Vec_Int_t * vXorRoots = Vec_IntAlloc( 100 );  int i;
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
        if ( !Vec_BitEntry(vMapXorIns, Vec_IntEntry(vXors, 4*i)) )
            Vec_IntPushUniqueOrder( vXorRoots, Vec_IntEntry(vXors, 4*i) );
    Vec_BitFree( vMapXorIns );
    return vXorRoots;
}